

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas3_d.cpp
# Opt level: O0

void dtrmm(char side,char uplo,char transa,char diag,int m,int n,double alpha,double *a,int lda,
          double *b,int ldb)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  allocator<char> local_71;
  string local_70;
  uint local_4c;
  double dStack_48;
  int upper;
  double temp;
  uint local_38;
  int nrowa;
  int nounit;
  int lside;
  int k;
  int j;
  int info;
  int i;
  double alpha_local;
  int local_10;
  int n_local;
  int m_local;
  char diag_local;
  char transa_local;
  char uplo_local;
  char side_local;
  
  _info = alpha;
  alpha_local._4_4_ = n;
  local_10 = m;
  n_local._0_1_ = diag;
  n_local._1_1_ = transa;
  n_local._2_1_ = uplo;
  n_local._3_1_ = side;
  bVar2 = lsame(side,'L');
  nrowa = (int)bVar2;
  if (nrowa == 0) {
    temp._4_4_ = alpha_local._4_4_;
  }
  else {
    temp._4_4_ = local_10;
  }
  bVar2 = lsame((char)n_local,'N');
  local_38 = (uint)bVar2;
  bVar2 = lsame(n_local._2_1_,'U');
  local_4c = (uint)bVar2;
  k = 0;
  if ((nrowa != 0) || (bVar2 = lsame(n_local._3_1_,'R'), bVar2)) {
    if ((local_4c != 0) || (bVar2 = lsame(n_local._2_1_,'L'), bVar2)) {
      bVar2 = lsame(n_local._1_1_,'N');
      if ((bVar2) ||
         ((bVar2 = lsame(n_local._1_1_,'T'), bVar2 || (bVar2 = lsame(n_local._1_1_,'C'), bVar2)))) {
        bVar2 = lsame((char)n_local,'U');
        if ((bVar2) || (bVar2 = lsame((char)n_local,'N'), bVar2)) {
          if (local_10 < 0) {
            k = 5;
          }
          else if (alpha_local._4_4_ < 0) {
            k = 6;
          }
          else {
            iVar3 = i4_max(1,temp._4_4_);
            if (lda < iVar3) {
              k = 9;
            }
            else {
              iVar3 = i4_max(1,local_10);
              if (ldb < iVar3) {
                k = 0xb;
              }
            }
          }
        }
        else {
          k = 4;
        }
      }
      else {
        k = 3;
      }
    }
    else {
      k = 2;
    }
  }
  else {
    k = 1;
  }
  if (k == 0) {
    if (alpha_local._4_4_ != 0) {
      if ((_info != 0.0) || (NAN(_info))) {
        if (nrowa == 0) {
          bVar2 = lsame(n_local._1_1_,'n');
          if (bVar2) {
            if (local_4c == 0) {
              for (lside = 0; lside < alpha_local._4_4_; lside = lside + 1) {
                dStack_48 = _info;
                if (local_38 != 0) {
                  dStack_48 = _info * a[lside + lside * lda];
                }
                for (j = 0; nounit = lside, j < local_10; j = j + 1) {
                  b[j + lside * ldb] = dStack_48 * b[j + lside * ldb];
                }
                while (nounit = nounit + 1, nounit < alpha_local._4_4_) {
                  if ((a[nounit + lside * lda] != 0.0) || (NAN(a[nounit + lside * lda]))) {
                    dVar1 = a[nounit + lside * lda];
                    for (j = 0; j < local_10; j = j + 1) {
                      b[j + lside * ldb] = _info * dVar1 * b[j + nounit * ldb] + b[j + lside * ldb];
                    }
                  }
                }
              }
            }
            else {
              while (lside = alpha_local._4_4_ + -1, -1 < lside) {
                dStack_48 = _info;
                if (local_38 != 0) {
                  dStack_48 = _info * a[lside + lside * lda];
                }
                for (j = 0; j < local_10; j = j + 1) {
                  b[j + lside * ldb] = dStack_48 * b[j + lside * ldb];
                }
                for (nounit = 0; alpha_local._4_4_ = lside, nounit < lside; nounit = nounit + 1) {
                  if ((a[nounit + lside * lda] != 0.0) || (NAN(a[nounit + lside * lda]))) {
                    dVar1 = a[nounit + lside * lda];
                    for (j = 0; j < local_10; j = j + 1) {
                      b[j + lside * ldb] = _info * dVar1 * b[j + nounit * ldb] + b[j + lside * ldb];
                    }
                  }
                }
              }
            }
          }
          else {
            lside = alpha_local._4_4_;
            if (local_4c == 0) {
              while (nounit = lside + -1, -1 < nounit) {
                for (; lside < alpha_local._4_4_; lside = lside + 1) {
                  if ((a[lside + nounit * lda] != 0.0) || (NAN(a[lside + nounit * lda]))) {
                    dVar1 = a[lside + nounit * lda];
                    for (j = 0; j < local_10; j = j + 1) {
                      b[j + lside * ldb] = _info * dVar1 * b[j + nounit * ldb] + b[j + lside * ldb];
                    }
                  }
                }
                dStack_48 = _info;
                if (local_38 != 0) {
                  dStack_48 = _info * a[nounit + nounit * lda];
                }
                lside = nounit;
                if ((dStack_48 != 1.0) || (NAN(dStack_48))) {
                  for (j = 0; j < local_10; j = j + 1) {
                    b[j + nounit * ldb] = dStack_48 * b[j + nounit * ldb];
                  }
                }
              }
            }
            else {
              for (nounit = 0; nounit < alpha_local._4_4_; nounit = nounit + 1) {
                for (lside = 0; lside < nounit; lside = lside + 1) {
                  if ((a[lside + nounit * lda] != 0.0) || (NAN(a[lside + nounit * lda]))) {
                    dVar1 = a[lside + nounit * lda];
                    for (j = 0; j < local_10; j = j + 1) {
                      b[j + lside * ldb] = _info * dVar1 * b[j + nounit * ldb] + b[j + lside * ldb];
                    }
                  }
                }
                dStack_48 = _info;
                if (local_38 != 0) {
                  dStack_48 = _info * a[nounit + nounit * lda];
                }
                if ((dStack_48 != 1.0) || (NAN(dStack_48))) {
                  for (j = 0; j < local_10; j = j + 1) {
                    b[j + nounit * ldb] = dStack_48 * b[j + nounit * ldb];
                  }
                }
              }
            }
          }
        }
        else {
          bVar2 = lsame(n_local._1_1_,'N');
          if (bVar2) {
            if (local_4c == 0) {
              for (lside = 0; iVar3 = local_10, lside < alpha_local._4_4_; lside = lside + 1) {
                while (j = iVar3, nounit = j + -1, -1 < nounit) {
                  if ((b[nounit + lside * ldb] != 0.0) ||
                     (iVar3 = nounit, NAN(b[nounit + lside * ldb]))) {
                    dVar1 = b[nounit + lside * ldb];
                    b[nounit + lside * ldb] = _info * dVar1;
                    if (local_38 != 0) {
                      b[nounit + lside * ldb] = b[nounit + lside * ldb] * a[nounit + nounit * lda];
                    }
                    for (; iVar3 = nounit, j < local_10; j = j + 1) {
                      b[j + lside * ldb] = _info * dVar1 * a[j + nounit * lda] + b[j + lside * ldb];
                    }
                  }
                }
              }
            }
            else {
              for (lside = 0; lside < alpha_local._4_4_; lside = lside + 1) {
                for (nounit = 0; nounit < local_10; nounit = nounit + 1) {
                  if ((b[nounit + lside * ldb] != 0.0) || (NAN(b[nounit + lside * ldb]))) {
                    dStack_48 = _info * b[nounit + lside * ldb];
                    for (j = 0; j < nounit; j = j + 1) {
                      b[j + lside * ldb] = dStack_48 * a[j + nounit * lda] + b[j + lside * ldb];
                    }
                    if (local_38 != 0) {
                      dStack_48 = dStack_48 * a[nounit + nounit * lda];
                    }
                    b[nounit + lside * ldb] = dStack_48;
                  }
                }
              }
            }
          }
          else if (local_4c == 0) {
            for (lside = 0; lside < alpha_local._4_4_; lside = lside + 1) {
              for (j = 0; j < local_10; j = j + 1) {
                dStack_48 = b[j + lside * ldb];
                nounit = j;
                if (local_38 != 0) {
                  dStack_48 = dStack_48 * a[j + j * lda];
                }
                while (nounit = nounit + 1, nounit < local_10) {
                  dStack_48 = a[nounit + j * lda] * b[nounit + lside * ldb] + dStack_48;
                }
                b[j + lside * ldb] = _info * dStack_48;
              }
            }
          }
          else {
            for (lside = 0; j = local_10, lside < alpha_local._4_4_; lside = lside + 1) {
              while (j = j + -1, -1 < j) {
                dStack_48 = b[j + lside * ldb];
                if (local_38 != 0) {
                  dStack_48 = dStack_48 * a[j + j * lda];
                }
                for (nounit = 0; nounit < j; nounit = nounit + 1) {
                  dStack_48 = a[nounit + j * lda] * b[nounit + lside * ldb] + dStack_48;
                }
                b[j + lside * ldb] = _info * dStack_48;
              }
            }
          }
        }
      }
      else {
        for (lside = 0; lside < alpha_local._4_4_; lside = lside + 1) {
          for (j = 0; j < local_10; j = j + 1) {
            b[j + lside * ldb] = 0.0;
          }
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"DTRMM",&local_71);
    xerbla(&local_70,k);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return;
}

Assistant:

void dtrmm ( char side, char uplo, char transa, char diag, int m, int n, 
  double alpha, double a[], int lda, double b[], int ldb )

//****************************************************************************80
//
//  Purpose:
//
//    DTRMM performs B:=A*B or B:=B*A, A triangular, B rectangular.
//
//  Discussion:
//
//    This routine performs one of the matrix-matrix operations
//      B := alpha*op( A )*B,
//    or
//      B := alpha*B*op( A ),
//    where  alpha  is a scalar,  B  is an m by n matrix,  A  is a unit, or
//    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of
//      op( A ) = A   or   op( A ) = A'.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char SIDE, specifies whether op(A) multiplies B from
//    the left or right as follows:
//    'L' or 'l': B := alpha*op( A )*B.
//    'R' or 'r': B := alpha*B*op( A ).
//
//    Input, char UPLO, specifies whether the matrix A is an upper or
//    lower triangular matrix as follows:
//    'U' or 'u': A is an upper triangular matrix.
//    'L' or 'l': A is a lower triangular matrix.
//
//    Input, char TRANS, specifies the form of op( A ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n': op( A ) = A.
//    'T' or 't': op( A ) = A'.
//    'C' or 'c': op( A ) = A'.
//
//    Input, char DIAG, specifies whether or not A is unit triangular
//    as follows:
//    'U' or 'u': A is assumed to be unit triangular.
//    'N' or 'n': A is not assumed to be unit triangular.
//
//    Input, int M, the number of rows of B.  0 <= M.
//
//    Input, int N, the number of columns of B.  
//    0 <= N.
//
//    Input, double ALPHA, the scalar  alpha.  When alpha is
//    0.0, A is not referenced and B need not be set before entry.
//
//    Input, double A[LDA*K], where k is m when  SIDE = 'L' or 'l'  
//    and is  n  when  SIDE = 'R' or 'r'.
//    Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
//    upper triangular part of the array  A must contain the upper
//    triangular matrix  and the strictly lower triangular part of
//    A is not referenced.
//    Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
//    lower triangular part of the array  A must contain the lower
//    triangular matrix  and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'U' or 'u',  the diagonal elements of
//    A  are not referenced either,  but are assumed to be  unity.
//
//    Input, integer LDA, the first dimension of A as declared
//    in the calling program.  When SIDE = 'L' or 'l' then LDA must be at 
//    least max ( 1, M ); when SIDE = 'R' or 'r', LDA must be at least 
//    max ( 1, N ).
//
//    Input/output, double B[LDB*N].
//    Before entry, the leading m by n part of the array  B must contain 
//    the matrix  B, and on exit is overwritten by the transformed matrix.
//
//    Input, integer LDB, the first dimension of B as declared
//    in the calling program.   max ( 1, M ) <= LDB.
//
{
  int i;
  int info;
  int j;
  int k;
  int lside;
  int nounit;
  int nrowa;
  double temp;
  int upper;
//
//  Test the input parameters.
//
  lside = lsame ( side, 'L' );

  if ( lside )
  {
    nrowa = m;
  }
  else
  {
    nrowa = n;
  }

  nounit = lsame ( diag, 'N' );
  upper = lsame ( uplo, 'U' );

  info = 0;
  if ( ! lside && ! lsame ( side, 'R' ) )
  {
    info = 1;
  }
  else if ( ! upper && ! lsame ( uplo, 'L' ) )
  {
    info = 2;
  }
  else if ( ! lsame ( transa, 'N' ) && ! lsame ( transa, 'T' ) && 
            ! lsame ( transa, 'C' ) )
  {
    info = 3;
  }
  else if ( ! lsame ( diag, 'U' ) && ! lsame ( diag, 'N' ) )
  {
    info = 4;
  }
  else if ( m < 0 )
  {
    info = 5;
  }
  else if ( n < 0 )
  {
    info = 6;
  }
  else if ( lda < i4_max ( 1, nrowa ) )
  {
    info = 9;
  }
  else if ( ldb < i4_max ( 1, m ) )
  {
    info = 11;
  }

  if ( info != 0 ) 
  {
    xerbla ( "DTRMM", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 )
  {
    return;
  }
//
//  And when alpha is 0.0.
//
  if ( alpha == 0.0 )
  {
    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        b[i+j*ldb] = 0.0;
      }
    }
    return;
  }
//
//  Start the operations.
//
  if ( lside )
  {
//
//  Form  B := alpha*A*B.
//
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( k = 0; k < m; k++ )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              temp = alpha * b[k+j*ldb];
              for ( i = 0; i < k; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * a[i+k*lda];
              }
              if ( nounit )
              {
                temp = temp * a[k+k*lda];
              }
              b[k+j*ldb] = temp;
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( k = m - 1; 0 <= k; k-- )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              temp = alpha * b[k+j*ldb];
              b[k+j*ldb] = temp;
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] * a[k+k*lda];
              }
              for ( i = k + 1; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * a[i+k*lda];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*A'*B.
//
    else
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = m - 1; 0 <= i; i-- )
          {
            temp = b[i+j*ldb];
            if ( nounit )
            {
              temp = temp * a[i+i*lda];
            }
            for ( k = 0; k < i; k++ )
            {
              temp = temp + a[k+i*lda] * b[k+j*ldb];
            }
            b[i+j*ldb] = alpha * temp;
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = 0; i < m; i++ )
          {
            temp = b[i+j*ldb];
            if ( nounit )
            {
              temp = temp * a[i+i*lda];
            }
            for ( k = i + 1; k < m; k++ )
            {
              temp = temp + a[k+i*lda] * b[k+j*ldb];
            }
            b[i+j*ldb] = alpha * temp;
          }
        }
      }
    }
  }
//
//  Form  B := alpha*B*A.
//
  else
  {
    if ( lsame ( transa, 'n' ) )
    {
      if ( upper )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = 0; i < m; i++ )
          {
            b[i+j*ldb] = temp * b[i+j*ldb];
          }
          for ( k = 0; k < j; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              temp = alpha * a[k+j*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = 0; i < m; i++ )
          {
            b[i+j*ldb] = temp * b[i+j*ldb];
          }
          for ( k = j + 1; k < n; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              temp = alpha * a[k+j*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*B*A'.
//
    else
    {
      if ( upper )
      {
        for ( k = 0; k < n; k++ )
        {
          for ( j = 0; j < k; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = alpha * a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[k+k*lda];
          }
          if ( temp != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
        }
      }
      else
      {
        for ( k = n - 1; 0 <= k; k-- )
        {
          for ( j = k + 1; j < n; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = alpha * a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[k+k*lda];
          }
          if ( temp != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
        }
      }
    }
  }
  return;
}